

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDASetConstraints(void *ida_mem,N_Vector constraints)

{
  N_Vector p_Var1;
  long in_RSI;
  IDAMem in_RDI;
  double dVar2;
  sunrealtype temptest;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x237,"IDASetConstraints",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RSI == 0) {
    if (in_RDI->ida_constraintsMallocDone != 0) {
      N_VDestroy(in_RDI->ida_constraints);
      in_RDI->ida_lrw = in_RDI->ida_lrw - in_RDI->ida_lrw1;
      in_RDI->ida_liw = in_RDI->ida_liw - in_RDI->ida_liw1;
    }
    in_RDI->ida_constraintsMallocDone = 0;
    in_RDI->ida_constraintsSet = 0;
    local_4 = 0;
  }
  else if ((((*(long *)(*(long *)(in_RSI + 8) + 0x70) == 0) ||
            (*(long *)(*(long *)(in_RSI + 8) + 0xa0) == 0)) ||
           (*(long *)(*(long *)(in_RSI + 8) + 0xd0) == 0)) ||
          ((*(long *)(*(long *)(in_RSI + 8) + 0xe0) == 0 ||
           (*(long *)(*(long *)(in_RSI + 8) + 0xe8) == 0)))) {
    IDAProcessError(in_RDI,-0x16,0x251,"IDASetConstraints",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                    ,"A required vector operation is not implemented.");
    local_4 = -0x16;
  }
  else {
    dVar2 = (double)N_VMaxNorm(in_RSI);
    if ((2.5 < dVar2) || (dVar2 < 0.5)) {
      IDAProcessError(in_RDI,-0x16,0x25b,"IDASetConstraints",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                      ,"Illegal values in constraints vector.");
      local_4 = -0x16;
    }
    else {
      if (in_RDI->ida_constraintsMallocDone == 0) {
        p_Var1 = (N_Vector)N_VClone(in_RSI);
        in_RDI->ida_constraints = p_Var1;
        in_RDI->ida_lrw = in_RDI->ida_lrw1 + in_RDI->ida_lrw;
        in_RDI->ida_liw = in_RDI->ida_liw1 + in_RDI->ida_liw;
        in_RDI->ida_constraintsMallocDone = 1;
      }
      N_VScale(0x3ff0000000000000,in_RSI,in_RDI->ida_constraints);
      in_RDI->ida_constraintsSet = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int IDASetConstraints(void* ida_mem, N_Vector constraints)
{
  IDAMem IDA_mem;
  sunrealtype temptest;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (constraints == NULL)
  {
    if (IDA_mem->ida_constraintsMallocDone)
    {
      N_VDestroy(IDA_mem->ida_constraints);
      IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
      IDA_mem->ida_liw -= IDA_mem->ida_liw1;
    }
    IDA_mem->ida_constraintsMallocDone = SUNFALSE;
    IDA_mem->ida_constraintsSet        = SUNFALSE;
    return (IDA_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv == NULL || constraints->ops->nvmaxnorm == NULL ||
      constraints->ops->nvcompare == NULL ||
      constraints->ops->nvconstrmask == NULL ||
      constraints->ops->nvminquotient == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    return (IDA_ILL_INPUT);
  }

  /*  Check the constraints vector */

  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_CONSTR);
    return (IDA_ILL_INPUT);
  }

  if (!(IDA_mem->ida_constraintsMallocDone))
  {
    IDA_mem->ida_constraints = N_VClone(constraints);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */

  N_VScale(ONE, constraints, IDA_mem->ida_constraints);

  IDA_mem->ida_constraintsSet = SUNTRUE;

  return (IDA_SUCCESS);
}